

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::DatePartCachedFunction<duckdb::DatePart::YearOperator,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *pVVar1;
  ulong *puVar2;
  element_type *count;
  int64_t *piVar3;
  int64_t *piVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  byte bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  SelectionVector *pSVar11;
  SelectionVector *pSVar12;
  data_ptr_t pdVar13;
  date_t dVar14;
  reference vector;
  undefined1 *puVar15;
  element_type *peVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  int64_t iVar18;
  ulong uVar19;
  data_ptr_t pdVar20;
  idx_t idx_in_entry;
  element_type *peVar21;
  unsigned_long uVar22;
  element_type *peVar23;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  data_ptr_t local_a0;
  ValidityMask *local_98;
  ulong local_90;
  data_ptr_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_78.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_78);
  pSVar11 = local_78.sel;
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = (element_type *)args->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar20 = result->data;
    pdVar6 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = &result->validity;
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != (element_type *)0x0) {
        peVar21 = (element_type *)0x0;
        do {
          dVar14 = Timestamp::GetDate((timestamp_t)*(int64_t *)(pdVar6 + (long)peVar21 * 8));
          iVar18 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                              &pSVar11->selection_data,dVar14,pVVar1,(idx_t)peVar21);
          *(int64_t *)(pdVar20 + (long)peVar21 * 8) = iVar18;
          peVar21 = (element_type *)
                    ((long)&(peVar21->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t + 1);
        } while (count != peVar21);
      }
    }
    else {
      local_98 = &vector->validity;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
      local_b8 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)local_98,(unsigned_long *)&local_b8);
      pdVar13 = local_78.data;
      pSVar12 = local_78.sel;
      local_78.sel = (SelectionVector *)0x0;
      local_78.data = (data_ptr_t)0x0;
      p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pSVar12;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar13;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
      }
      pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar17->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      puVar15 = (undefined1 *)
                ((long)&count[7].owned_data.
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t + 7);
      if ((undefined1 *)0x3f < puVar15) {
        local_90 = 0;
        peVar21 = (element_type *)0x0;
        local_a0 = pdVar20;
        do {
          puVar5 = (local_98->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar22 = 0xffffffffffffffff;
          }
          else {
            uVar22 = puVar5[local_90];
          }
          peVar16 = peVar21 + 8;
          if (count <= peVar21 + 8) {
            peVar16 = count;
          }
          peVar23 = peVar16;
          if (uVar22 != 0) {
            peVar23 = peVar21;
            if (uVar22 == 0xffffffffffffffff) {
              if (peVar21 < peVar16) {
                do {
                  dVar14 = Timestamp::GetDate((timestamp_t)*(int64_t *)(pdVar6 + (long)peVar23 * 8))
                  ;
                  iVar18 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                                     ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                                      &pSVar11->selection_data,dVar14,pVVar1,(idx_t)peVar23);
                  *(int64_t *)(pdVar20 + (long)peVar23 * 8) = iVar18;
                  peVar23 = (element_type *)
                            ((long)&(peVar23->owned_data).
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    ._M_t + 1);
                } while (peVar16 != peVar23);
              }
            }
            else if (peVar21 < peVar16) {
              local_88 = pdVar20 + (long)peVar21 * 8;
              uVar19 = 0;
              do {
                if ((uVar22 >> (uVar19 & 0x3f) & 1) != 0) {
                  dVar14 = Timestamp::GetDate((timestamp_t)
                                              *(int64_t *)(pdVar6 + uVar19 * 8 + (long)peVar21 * 8))
                  ;
                  iVar18 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                                     ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                                      &pSVar11->selection_data,dVar14,pVVar1,
                                      (long)&(peVar21->owned_data).
                                             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                             ._M_t + uVar19);
                  *(int64_t *)(local_88 + uVar19 * 8) = iVar18;
                }
                uVar19 = uVar19 + 1;
              } while ((long)peVar21 + (uVar19 - (long)peVar16) != 0);
              pdVar20 = local_a0;
              peVar23 = (element_type *)
                        ((long)&(peVar21->owned_data).
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                ._M_t + uVar19);
            }
          }
          local_90 = local_90 + 1;
          peVar21 = peVar23;
        } while (local_90 != (ulong)puVar15 >> 6);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    piVar3 = (int64_t *)result->data;
    piVar4 = (int64_t *)vector->data;
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      dVar14 = Timestamp::GetDate((timestamp_t)*piVar4);
      iVar18 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                         ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                          &pSVar11->selection_data,dVar14,&result->validity,0);
      *piVar3 = iVar18;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,(idx_t)count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar12 = local_78.sel;
    pdVar20 = result->data;
    FlatVector::VerifyFlatVector(result);
    pVVar1 = &result->validity;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != (element_type *)0x0) {
        _Var7._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&pSVar12->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        peVar21 = (element_type *)0x0;
        do {
          peVar16 = peVar21;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var7._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            peVar16 = (element_type *)
                      (ulong)*(uint *)((long)_Var7._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl + (long)peVar21 * 4);
          }
          dVar14 = Timestamp::GetDate((timestamp_t)((_func_int ***)local_78.data)[(long)peVar16]);
          iVar18 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                              &pSVar11->selection_data,dVar14,pVVar1,(idx_t)peVar21);
          *(int64_t *)(pdVar20 + (long)peVar21 * 8) = iVar18;
          peVar21 = (element_type *)
                    ((long)&(peVar21->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t + 1);
        } while (count != peVar21);
      }
    }
    else if (count != (element_type *)0x0) {
      _Var7._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (((unsafe_unique_array<unsigned_long> *)&pSVar12->sel_vector)->
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
      peVar21 = (element_type *)0x0;
      do {
        peVar16 = peVar21;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var7._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          peVar16 = (element_type *)
                    (ulong)*(uint *)((long)_Var7._M_t.
                                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                           .super__Head_base<0UL,_unsigned_long_*,_false>.
                                           _M_head_impl + (long)peVar21 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)peVar16 >> 6] >> ((ulong)peVar16 & 0x3f) & 1) == 0) {
          if ((pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_b8,&local_80);
            p_Var10 = p_Stack_b0;
            peVar16 = local_b8;
            local_b8 = (element_type *)0x0;
            p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar16;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
            }
            if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar9 = (byte)peVar21 & 0x3f;
          puVar2 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   ((ulong)peVar21 >> 6);
          *puVar2 = *puVar2 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        }
        else {
          dVar14 = Timestamp::GetDate((timestamp_t)((_func_int ***)local_78.data)[(long)peVar16]);
          iVar18 = DateLookupCache<duckdb::DatePart::YearOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::YearOperator> *)
                              &pSVar11->selection_data,dVar14,pVVar1,(idx_t)peVar21);
          *(int64_t *)(pdVar20 + (long)peVar21 * 8) = iVar18;
        }
        peVar21 = (element_type *)
                  ((long)&(peVar21->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t + 1);
      } while (count != peVar21);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}